

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

StackSym * __thiscall GlobOpt::GetTaggedIntConstantStackSym(GlobOpt *this,int32 intConstantValue)

{
  StackSym **ppSVar1;
  long local_18;
  StackSym *local_10;
  
  local_18 = (long)intConstantValue;
  local_10 = (StackSym *)0x0;
  ppSVar1 = JsUtil::
            BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::LookupWithKey<long>(this->intConstantToStackSymMap,&local_18,&local_10);
  return *ppSVar1;
}

Assistant:

StackSym *GlobOpt::GetTaggedIntConstantStackSym(const int32 intConstantValue) const
{
    Assert(!Js::TaggedInt::IsOverflow(intConstantValue));

    return intConstantToStackSymMap->Lookup(intConstantValue, nullptr);
}